

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_tvp.c
# Opt level: O2

int jas_tvparser_next(jas_tvparser_t *tvp)

{
  ushort uVar1;
  char *pcVar2;
  ushort **ppuVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char cVar7;
  ulong uVar8;
  
  pcVar6 = tvp->pos;
  while( true ) {
    cVar7 = *pcVar6;
    uVar8 = (ulong)cVar7;
    if (uVar8 == 0) {
      tvp->pos = pcVar6;
      return 1;
    }
    ppuVar3 = __ctype_b_loc();
    uVar1 = (*ppuVar3)[uVar8];
    if ((uVar1 >> 0xd & 1) == 0) break;
    pcVar6 = pcVar6 + 1;
  }
  pcVar5 = pcVar6;
  if ((cVar7 != '_') && ((uVar1 & 0xc00) == 0)) {
    return -1;
  }
  do {
    cVar7 = (char)uVar8;
    if (cVar7 == '\0') {
LAB_0011474f:
      tvp->tag = pcVar6;
      tvp->val = "";
      tvp->pos = pcVar5;
      return 0;
    }
    if ((cVar7 != '_') && (uVar1 = (*ppuVar3)[cVar7], (uVar1 & 0xc00) == 0)) {
      if (cVar7 == '=') {
        *pcVar5 = '\0';
        pcVar2 = pcVar5 + 1;
        break;
      }
      if ((uVar1 >> 0xd & 1) == 0) {
        return -1;
      }
      *pcVar5 = '\0';
      pcVar5 = pcVar5 + 1;
      goto LAB_0011474f;
    }
    uVar8 = (ulong)(byte)pcVar5[1];
    pcVar5 = pcVar5 + 1;
  } while( true );
  while (pcVar2 = pcVar4 + 1, (*(byte *)((long)*ppuVar3 + (long)*pcVar4 * 2 + 1) & 0x20) == 0) {
    pcVar4 = pcVar2;
    if ((long)*pcVar4 == 0) goto LAB_00114767;
  }
  *pcVar4 = '\0';
  pcVar4 = pcVar4 + 1;
LAB_00114767:
  tvp->pos = pcVar4;
  tvp->tag = pcVar6;
  tvp->val = pcVar5 + 1;
  return 0;
}

Assistant:

int jas_tvparser_next(jas_tvparser_t *tvp)
{
	char *p;
	char *tag;
	char *val;

	/* Skip any leading whitespace. */
	p = tvp->pos;
	while (*p != '\0' && isspace(*p)) {
		++p;
	}

	/* Has the end of the input data been reached? */
	if (*p == '\0') {
		/* No more tags are present. */
		tvp->pos = p;
		return 1;
	}

	/* Does the tag name begin with a valid character? */
	if (!JAS_TVP_ISTAG(*p)) {
		return -1;
	}

	/* Remember where the tag name begins. */
	tag = p;

	/* Find the end of the tag name. */
	while (*p != '\0' && JAS_TVP_ISTAG(*p)) {
		++p;
	}

	/* Has the end of the input data been reached? */
	if (*p == '\0') {
		/* The value field is empty. */
		tvp->tag = tag;
		tvp->val = "";
		tvp->pos = p;
		return 0;
	}

	/* Is a value field not present? */
	if (*p != '=') {
		if (*p != '\0' && !isspace(*p)) {
			return -1;
		}
		*p++ = '\0';
		tvp->tag = tag;
		tvp->val = "";
		tvp->pos = p;
		return 0;
	}

	*p++ = '\0';

	val = p;
	while (*p != '\0' && !isspace(*p)) {
		++p;
	}

	if (*p != '\0') {
		*p++ = '\0';
	}

	tvp->pos = p;
	tvp->tag = tag;
	tvp->val = val;

	return 0;
}